

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifest.cpp
# Opt level: O0

bool __thiscall llbuild::ninja::Rule::isValidParameterName(Rule *this,StringRef name)

{
  bool bVar1;
  bool local_689;
  bool local_591;
  bool local_581;
  char *local_570 [2];
  Rule *local_560;
  char *local_558;
  char *local_550 [2];
  Rule *local_540;
  char *local_538;
  char *local_530 [2];
  Rule *local_520;
  char *local_518;
  char *local_510 [2];
  Rule *local_500;
  char *local_4f8;
  char *local_4f0 [2];
  Rule *local_4e0;
  char *local_4d8;
  char *local_4d0 [2];
  Rule *local_4c0;
  char *local_4b8;
  char *local_4b0 [2];
  Rule *local_4a0;
  char *local_498;
  char *local_490 [2];
  Rule *local_480;
  char *local_478;
  char *local_470 [2];
  Rule *local_460;
  char *local_458;
  Rule *local_450;
  StringRef name_local;
  Rule *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  Rule *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  Rule *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  Rule *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  Rule *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  Rule *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  Rule *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  Rule *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  Rule *local_2a0;
  char *local_298;
  char *local_290;
  char **local_288;
  char *local_280;
  char **local_278;
  char *local_270;
  char **local_268;
  char *local_260;
  char **local_258;
  char *local_250;
  char **local_248;
  char *local_240;
  char **local_238;
  char *local_230;
  char **local_228;
  char *local_220;
  char **local_218;
  char *local_210;
  char **local_208;
  Rule **local_200;
  char *local_1f8;
  char *local_1f0;
  Rule **local_1e8;
  char *local_1e0;
  char *local_1d8;
  Rule **local_1d0;
  char *local_1c8;
  char *local_1c0;
  Rule **local_1b8;
  char *local_1b0;
  char *local_1a8;
  Rule **local_1a0;
  char *local_198;
  char *local_190;
  Rule **local_188;
  char *local_180;
  char *local_178;
  Rule **local_170;
  char *local_168;
  char *local_160;
  Rule **local_158;
  char *local_150;
  char *local_148;
  Rule **local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  Rule *local_118;
  int local_10c;
  char *local_108;
  char *local_100;
  Rule *local_f8;
  int local_ec;
  char *local_e8;
  char *local_e0;
  Rule *local_d8;
  int local_cc;
  char *local_c8;
  char *local_c0;
  Rule *local_b8;
  int local_ac;
  char *local_a8;
  char *local_a0;
  Rule *local_98;
  int local_8c;
  char *local_88;
  char *local_80;
  Rule *local_78;
  int local_6c;
  char *local_68;
  char *local_60;
  Rule *local_58;
  int local_4c;
  char *local_48;
  char *local_40;
  Rule *local_38;
  int local_2c;
  char *local_28;
  char *local_20;
  Rule *local_18;
  int local_c;
  
  local_458 = name.Data;
  local_288 = local_470;
  local_290 = "command";
  local_470[0] = "command";
  local_460 = this;
  local_450 = this;
  name_local.Data = local_458;
  local_2b8 = (char *)strlen("command");
  local_2a0 = local_460;
  local_298 = local_458;
  local_2b0 = local_470[0];
  local_2c0 = local_470[0];
  local_1f8 = local_470[0];
  local_200 = &local_2a0;
  local_581 = false;
  local_2a8 = local_2b8;
  local_1f0 = local_2b8;
  if (local_458 == local_2b8) {
    local_18 = local_460;
    local_20 = local_470[0];
    local_28 = local_2b8;
    if (local_2b8 == (char *)0x0) {
      local_c = 0;
    }
    else {
      local_c = memcmp(local_460,local_470[0],(size_t)local_2b8);
    }
    local_581 = local_c == 0;
  }
  local_591 = true;
  if (!local_581) {
    local_480 = local_450;
    local_478 = name_local.Data;
    local_278 = local_490;
    local_280 = "description";
    local_490[0] = "description";
    local_2e8 = (char *)strlen("description");
    local_2d0 = local_480;
    local_2c8 = local_478;
    local_2e0 = local_490[0];
    local_2f0 = local_490[0];
    local_1e0 = local_490[0];
    local_1e8 = &local_2d0;
    bVar1 = false;
    local_2d8 = local_2e8;
    local_1d8 = local_2e8;
    if (local_478 == local_2e8) {
      local_38 = local_480;
      local_40 = local_490[0];
      local_48 = local_2e8;
      if (local_2e8 == (char *)0x0) {
        local_2c = 0;
      }
      else {
        local_2c = memcmp(local_480,local_490[0],(size_t)local_2e8);
      }
      bVar1 = local_2c == 0;
    }
    local_591 = true;
    if (!bVar1) {
      local_4a0 = local_450;
      local_498 = name_local.Data;
      local_268 = local_4b0;
      local_270 = "deps";
      local_4b0[0] = "deps";
      local_318 = (char *)strlen("deps");
      local_300 = local_4a0;
      local_2f8 = local_498;
      local_310 = local_4b0[0];
      local_320 = local_4b0[0];
      local_1c8 = local_4b0[0];
      local_1d0 = &local_300;
      bVar1 = false;
      local_308 = local_318;
      local_1c0 = local_318;
      if (local_498 == local_318) {
        local_58 = local_4a0;
        local_60 = local_4b0[0];
        local_68 = local_318;
        if (local_318 == (char *)0x0) {
          local_4c = 0;
        }
        else {
          local_4c = memcmp(local_4a0,local_4b0[0],(size_t)local_318);
        }
        bVar1 = local_4c == 0;
      }
      local_591 = true;
      if (!bVar1) {
        local_4c0 = local_450;
        local_4b8 = name_local.Data;
        local_258 = local_4d0;
        local_260 = "depfile";
        local_4d0[0] = "depfile";
        local_348 = (char *)strlen("depfile");
        local_330 = local_4c0;
        local_328 = local_4b8;
        local_340 = local_4d0[0];
        local_350 = local_4d0[0];
        local_1b0 = local_4d0[0];
        local_1b8 = &local_330;
        bVar1 = false;
        local_338 = local_348;
        local_1a8 = local_348;
        if (local_4b8 == local_348) {
          local_78 = local_4c0;
          local_80 = local_4d0[0];
          local_88 = local_348;
          if (local_348 == (char *)0x0) {
            local_6c = 0;
          }
          else {
            local_6c = memcmp(local_4c0,local_4d0[0],(size_t)local_348);
          }
          bVar1 = local_6c == 0;
        }
        local_591 = true;
        if (!bVar1) {
          local_4e0 = local_450;
          local_4d8 = name_local.Data;
          local_248 = local_4f0;
          local_250 = "generator";
          local_4f0[0] = "generator";
          local_378 = (char *)strlen("generator");
          local_360 = local_4e0;
          local_358 = local_4d8;
          local_370 = local_4f0[0];
          local_380 = local_4f0[0];
          local_198 = local_4f0[0];
          local_1a0 = &local_360;
          bVar1 = false;
          local_368 = local_378;
          local_190 = local_378;
          if (local_4d8 == local_378) {
            local_98 = local_4e0;
            local_a0 = local_4f0[0];
            local_a8 = local_378;
            if (local_378 == (char *)0x0) {
              local_8c = 0;
            }
            else {
              local_8c = memcmp(local_4e0,local_4f0[0],(size_t)local_378);
            }
            bVar1 = local_8c == 0;
          }
          local_591 = true;
          if (!bVar1) {
            local_500 = local_450;
            local_4f8 = name_local.Data;
            local_238 = local_510;
            local_240 = "pool";
            local_510[0] = "pool";
            local_3a8 = (char *)strlen("pool");
            local_390 = local_500;
            local_388 = local_4f8;
            local_3a0 = local_510[0];
            local_3b0 = local_510[0];
            local_180 = local_510[0];
            local_188 = &local_390;
            bVar1 = false;
            local_398 = local_3a8;
            local_178 = local_3a8;
            if (local_4f8 == local_3a8) {
              local_b8 = local_500;
              local_c0 = local_510[0];
              local_c8 = local_3a8;
              if (local_3a8 == (char *)0x0) {
                local_ac = 0;
              }
              else {
                local_ac = memcmp(local_500,local_510[0],(size_t)local_3a8);
              }
              bVar1 = local_ac == 0;
            }
            local_591 = true;
            if (!bVar1) {
              local_520 = local_450;
              local_518 = name_local.Data;
              local_228 = local_530;
              local_230 = "restat";
              local_530[0] = "restat";
              local_3d8 = (char *)strlen("restat");
              local_3c0 = local_520;
              local_3b8 = local_518;
              local_3d0 = local_530[0];
              local_3e0 = local_530[0];
              local_168 = local_530[0];
              local_170 = &local_3c0;
              bVar1 = false;
              local_3c8 = local_3d8;
              local_160 = local_3d8;
              if (local_518 == local_3d8) {
                local_d8 = local_520;
                local_e0 = local_530[0];
                local_e8 = local_3d8;
                if (local_3d8 == (char *)0x0) {
                  local_cc = 0;
                }
                else {
                  local_cc = memcmp(local_520,local_530[0],(size_t)local_3d8);
                }
                bVar1 = local_cc == 0;
              }
              local_591 = true;
              if (!bVar1) {
                local_540 = local_450;
                local_538 = name_local.Data;
                local_218 = local_550;
                local_220 = "rspfile";
                local_550[0] = "rspfile";
                local_408 = (char *)strlen("rspfile");
                local_3f0 = local_540;
                local_3e8 = local_538;
                local_400 = local_550[0];
                local_410 = local_550[0];
                local_150 = local_550[0];
                local_158 = &local_3f0;
                bVar1 = false;
                local_3f8 = local_408;
                local_148 = local_408;
                if (local_538 == local_408) {
                  local_f8 = local_540;
                  local_100 = local_550[0];
                  local_108 = local_408;
                  if (local_408 == (char *)0x0) {
                    local_ec = 0;
                  }
                  else {
                    local_ec = memcmp(local_540,local_550[0],(size_t)local_408);
                  }
                  bVar1 = local_ec == 0;
                }
                local_591 = true;
                if (!bVar1) {
                  local_560 = local_450;
                  local_558 = name_local.Data;
                  local_208 = local_570;
                  local_210 = "rspfile_content";
                  local_570[0] = "rspfile_content";
                  local_130 = (char *)strlen("rspfile_content");
                  local_420 = local_560;
                  local_418 = local_558;
                  name_local.Length = (size_t)local_570[0];
                  local_138 = local_570[0];
                  local_140 = &local_420;
                  local_689 = false;
                  if (local_558 == local_130) {
                    local_118 = local_560;
                    local_120 = local_570[0];
                    if (local_130 == (char *)0x0) {
                      local_10c = 0;
                    }
                    else {
                      local_128 = local_130;
                      local_10c = memcmp(local_560,local_570[0],(size_t)local_130);
                    }
                    local_689 = local_10c == 0;
                  }
                  local_591 = local_689;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_591;
}

Assistant:

bool Rule::isValidParameterName(StringRef name) {
  return name == "command" ||
    name == "description" ||
    name == "deps" ||
    name == "depfile" ||
    name == "generator" ||
    name == "pool" ||
    name == "restat" ||
    name == "rspfile" ||
    name == "rspfile_content";
}